

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

pair<const_char_*,_bool> __thiscall
google::protobuf::internal::EpsCopyInputStream::DoneFallback<true>
          (EpsCopyInputStream *this,int overrun,int depth)

{
  char *pcVar1;
  int iVar2;
  undefined8 unaff_RBX;
  ulong uVar3;
  uint uVar4;
  pair<const_char_*,_bool> pVar5;
  LogMessageFatal LStack_38;
  
  uVar4 = this->limit_;
  uVar3 = CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
  if ((int)uVar4 < overrun) {
LAB_001e8247:
    pcVar1 = (char *)0x0;
LAB_001e8238:
    pVar5._8_8_ = uVar3 & 0xffffffff;
    pVar5.first = pcVar1;
    return pVar5;
  }
  if (uVar4 == overrun) {
    pcVar1 = "overrun != limit_";
    iVar2 = 0xad;
  }
  else if (overrun < (int)uVar4) {
    if (this->limit_end_ == this->buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4)) {
      pcVar1 = absl::lts_20250127::log_internal::Check_GTImpl(uVar4,0,"limit_ > 0");
      if (pcVar1 == (Nullable<const_char_*>)0x0) {
        if (this->limit_end_ == this->buffer_end_) {
          do {
            pcVar1 = absl::lts_20250127::log_internal::Check_GEImpl(overrun,0,"overrun >= 0");
            if (pcVar1 != (Nullable<const_char_*>)0x0) {
              iVar2 = 0xba;
              goto LAB_001e82b5;
            }
            pcVar1 = NextBuffer<true>(this,overrun,depth);
            if (pcVar1 == (char *)0x0) {
              if (overrun != 0) goto LAB_001e8247;
              pcVar1 = absl::lts_20250127::log_internal::Check_GTImpl(this->limit_,0,"limit_ > 0");
              if (pcVar1 != (Nullable<const_char_*>)0x0) {
                iVar2 = 0xbf;
                goto LAB_001e82b5;
              }
              pcVar1 = this->buffer_end_;
              this->limit_end_ = pcVar1;
              this->last_tag_minus_1_ = 1;
              goto LAB_001e8238;
            }
            iVar2 = (int)this->buffer_end_;
            uVar4 = ((int)pcVar1 - iVar2) + this->limit_;
            this->limit_ = uVar4;
            pcVar1 = pcVar1 + overrun;
            overrun = (int)pcVar1 - iVar2;
          } while (-1 < overrun);
          this->limit_end_ = this->buffer_end_ + (int)((int)uVar4 >> 0x1f & uVar4);
          uVar3 = 0;
          goto LAB_001e8238;
        }
        pcVar1 = "limit_end_ == buffer_end_";
        iVar2 = 0xb6;
      }
      else {
        iVar2 = 0xb5;
      }
    }
    else {
      pcVar1 = "limit_end_ == buffer_end_ + (std::min)(0, limit_)";
      iVar2 = 0xb3;
    }
  }
  else {
    pcVar1 = "overrun < limit_";
    iVar2 = 0xae;
  }
LAB_001e82b5:
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&LStack_38,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.cc"
             ,iVar2,pcVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&LStack_38);
}

Assistant:

std::pair<const char*, bool> EpsCopyInputStream::DoneFallback(int overrun,
                                                              int depth) {
  // Did we exceeded the limit (parse error).
  if (ABSL_PREDICT_FALSE(overrun > limit_)) return {nullptr, true};
  ABSL_DCHECK(overrun != limit_);  // Guaranteed by caller.
  ABSL_DCHECK(overrun < limit_);   // Follows from above
  // TODO Instead of this dcheck we could just assign, and remove
  // updating the limit_end from PopLimit, ie.
  // limit_end_ = buffer_end_ + (std::min)(0, limit_);
  // if (ptr < limit_end_) return {ptr, false};
  ABSL_DCHECK(limit_end_ == buffer_end_ + (std::min)(0, limit_));
  // At this point we know the following assertion holds.
  ABSL_DCHECK_GT(limit_, 0);
  ABSL_DCHECK(limit_end_ == buffer_end_);  // because limit_ > 0
  const char* p;
  do {
    // We are past the end of buffer_end_, in the slop region.
    ABSL_DCHECK_GE(overrun, 0);
    p = NextBuffer<kExperimentalV2>(overrun, depth);
    if (p == nullptr) {
      // We are at the end of the stream
      if (ABSL_PREDICT_FALSE(overrun != 0)) return {nullptr, true};
      ABSL_DCHECK_GT(limit_, 0);
      limit_end_ = buffer_end_;
      // Distinguish ending on a pushed limit or ending on end-of-stream.
      SetEndOfStream();
      return {buffer_end_, true};
    }
    limit_ -= buffer_end_ - p;  // Adjust limit_ relative to new anchor
    p += overrun;
    overrun = p - buffer_end_;
  } while (overrun >= 0);
  limit_end_ = buffer_end_ + std::min(0, limit_);
  return {p, false};
}